

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O3

lzma_ret block_encode_uncompressed
                   (lzma_block *block,uint8_t *in,size_t in_size,uint8_t *out,size_t *out_pos,
                   size_t out_size)

{
  lzma_filter *plVar1;
  uint8_t uVar2;
  lzma_ret lVar3;
  lzma_ret lVar4;
  lzma_vli lVar5;
  ulong uVar6;
  size_t sVar7;
  size_t __n;
  lzma_filter filters [2];
  lzma_options_lzma lzma2;
  lzma_filter local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_c8.options = &local_a8;
  uStack_a0 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0x1000;
  local_c8.id = 0x21;
  local_b8 = 0xffffffffffffffff;
  plVar1 = block->filters;
  block->filters = &local_c8;
  lVar3 = lzma_block_header_size(block);
  lVar4 = LZMA_PROG_ERROR;
  if (lVar3 == LZMA_OK) {
    if (in_size < 0x7ffffffffffffbbd) {
      uVar6 = in_size + 0xffff >> 0x10;
      lVar5 = 0;
      if (in_size <= uVar6 * -3 + 0x7ffffffffffffbbb) {
        lVar5 = in_size + 1 + uVar6 * 3;
      }
    }
    else {
      lVar5 = 0;
    }
    if (block->compressed_size != lVar5) {
      __assert_fail("block->compressed_size == lzma2_bound(in_size)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                    ,0x77,
                    "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                   );
    }
    lVar4 = LZMA_BUF_ERROR;
    if (block->compressed_size + (ulong)block->header_size <= out_size - *out_pos) {
      lVar3 = lzma_block_header_encode(block,out + *out_pos);
      block->filters = plVar1;
      if (lVar3 != LZMA_OK) {
        return LZMA_PROG_ERROR;
      }
      sVar7 = (ulong)block->header_size + *out_pos;
      if (in_size != 0) {
        uVar2 = '\x01';
        uVar6 = 0;
        do {
          *out_pos = sVar7 + 1;
          out[sVar7] = uVar2;
          __n = in_size - uVar6;
          if (0xffff < __n) {
            __n = 0x10000;
          }
          sVar7 = *out_pos;
          *out_pos = sVar7 + 1;
          out[sVar7] = (uint8_t)(__n - 1 >> 8);
          sVar7 = *out_pos;
          *out_pos = sVar7 + 1;
          out[sVar7] = (uint8_t)(__n - 1);
          if (out_size < *out_pos + __n) {
            __assert_fail("*out_pos + copy_size <= out_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                          ,0x97,
                          "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                         );
          }
          memcpy(out + *out_pos,in + uVar6,__n);
          uVar6 = uVar6 + __n;
          sVar7 = __n + *out_pos;
          *out_pos = sVar7;
          uVar2 = '\x02';
        } while (uVar6 < in_size);
      }
      *out_pos = sVar7 + 1;
      out[sVar7] = '\0';
      if (*out_pos <= out_size) {
        return LZMA_OK;
      }
      __assert_fail("*out_pos <= out_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                    ,0xa0,
                    "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                   );
    }
  }
  block->filters = plVar1;
  return lVar4;
}

Assistant:

static lzma_ret
block_encode_uncompressed(lzma_block *block, const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Use LZMA2 uncompressed chunks. We wouldn't need a dictionary at
	// all, but LZMA2 always requires a dictionary, so use the minimum
	// value to minimize memory usage of the decoder.
	lzma_options_lzma lzma2 = {
		.dict_size = LZMA_DICT_SIZE_MIN,
	};

	lzma_filter filters[2];
	filters[0].id = LZMA_FILTER_LZMA2;
	filters[0].options = &lzma2;
	filters[1].id = LZMA_VLI_UNKNOWN;

	// Set the above filter options to *block temporarily so that we can
	// encode the Block Header.
	lzma_filter *filters_orig = block->filters;
	block->filters = filters;

	if (lzma_block_header_size(block) != LZMA_OK) {
		block->filters = filters_orig;
		return LZMA_PROG_ERROR;
	}

	// Check that there's enough output space. The caller has already
	// set block->compressed_size to what lzma2_bound() has returned,
	// so we can reuse that value. We know that compressed_size is a
	// known valid VLI and header_size is a small value so their sum
	// will never overflow.
	assert(block->compressed_size == lzma2_bound(in_size));
	if (out_size - *out_pos
			< block->header_size + block->compressed_size) {
		block->filters = filters_orig;
		return LZMA_BUF_ERROR;
	}

	if (lzma_block_header_encode(block, out + *out_pos) != LZMA_OK) {
		block->filters = filters_orig;
		return LZMA_PROG_ERROR;
	}

	block->filters = filters_orig;
	*out_pos += block->header_size;

	// Encode the data using LZMA2 uncompressed chunks.
	size_t in_pos = 0;
	uint8_t control = 0x01; // Dictionary reset

	while (in_pos < in_size) {
		// Control byte: Indicate uncompressed chunk, of which
		// the first resets the dictionary.
		out[(*out_pos)++] = control;
		control = 0x02; // No dictionary reset

		// Size of the uncompressed chunk
		const size_t copy_size
				= my_min(in_size - in_pos, LZMA2_CHUNK_MAX);
		out[(*out_pos)++] = (copy_size - 1) >> 8;
		out[(*out_pos)++] = (copy_size - 1) & 0xFF;

		// The actual data
		assert(*out_pos + copy_size <= out_size);
		memcpy(out + *out_pos, in + in_pos, copy_size);

		in_pos += copy_size;
		*out_pos += copy_size;
	}

	// End marker
	out[(*out_pos)++] = 0x00;
	assert(*out_pos <= out_size);

	return LZMA_OK;
}